

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::JSFieldDefault_abi_cxx11_
                   (FieldDescriptor *field)

{
  bool bVar1;
  undefined1 uVar2;
  CppType CVar3;
  Type TVar4;
  EnumValueDescriptor *this;
  char *pcVar5;
  string *__lhs;
  string *out_00;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  bool is_valid;
  string out;
  LogMessage *in_stack_fffffffffffffc68;
  int i32;
  allocator *paVar6;
  LogMessage *in_stack_fffffffffffffc70;
  LogMessage *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc78;
  LogMessage *in_stack_fffffffffffffc80;
  AlphaNum *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcc0;
  FieldDescriptor *in_stack_fffffffffffffcc8;
  string *in_stack_fffffffffffffcd8;
  string *in_stack_fffffffffffffd38;
  allocator local_2aa [2];
  LogMessage local_2a8;
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  string local_228 [103];
  undefined1 local_1c1;
  string local_1c0 [39];
  allocator local_199 [97];
  string local_138 [80];
  string local_e8 [80];
  string local_98 [80];
  string local_48 [55];
  allocator local_11;
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x46a197);
  if (bVar1) {
    paVar6 = &local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"[]",paVar6);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x46a215);
    out_00 = (string *)(ulong)(CVar3 - CPPTYPE_INT32);
    switch(out_00) {
    case (string *)0x0:
      FieldDescriptor::default_value_int32(local_10);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffffc70,
                 (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
      StrCat_abi_cxx11_(in_stack_fffffffffffffca8);
      anon_unknown_0::MaybeNumberString(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_48);
      break;
    case (string *)0x1:
      FieldDescriptor::default_value_int64(local_10);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffffc70,(long)in_stack_fffffffffffffc68);
      StrCat_abi_cxx11_(in_stack_fffffffffffffca8);
      anon_unknown_0::MaybeNumberString(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_e8);
      break;
    case (string *)0x2:
      FieldDescriptor::default_value_uint32(local_10);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffffc70,
                 (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
      StrCat_abi_cxx11_(in_stack_fffffffffffffca8);
      anon_unknown_0::MaybeNumberString(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_98);
      break;
    case (string *)0x3:
      FieldDescriptor::default_value_uint64(local_10);
      strings::AlphaNum::AlphaNum
                ((AlphaNum *)in_stack_fffffffffffffc70,(long)in_stack_fffffffffffffc68);
      StrCat_abi_cxx11_(in_stack_fffffffffffffca8);
      anon_unknown_0::MaybeNumberString(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0);
      std::__cxx11::string::~string(local_138);
      break;
    case (string *)0x4:
      FieldDescriptor::default_value_double(local_10);
      DoubleToString_abi_cxx11_((double)in_stack_fffffffffffffcc8);
      break;
    case (string *)0x5:
      FieldDescriptor::default_value_float(local_10);
      FloatToString_abi_cxx11_((float)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      break;
    case (string *)0x6:
      bVar1 = FieldDescriptor::default_value_bool(local_10);
      pcVar5 = "false";
      if (bVar1) {
        pcVar5 = "true";
      }
      paVar6 = local_199;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,pcVar5,paVar6);
      std::allocator<char>::~allocator((allocator<char> *)local_199);
      break;
    case (string *)0x7:
      this = FieldDescriptor::default_value_enum((FieldDescriptor *)in_stack_fffffffffffffc70);
      i32 = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
      EnumValueDescriptor::number(this);
      strings::AlphaNum::AlphaNum((AlphaNum *)in_stack_fffffffffffffc70,i32);
      StrCat_abi_cxx11_(in_stack_fffffffffffffca8);
      break;
    case (string *)0x8:
      TVar4 = FieldDescriptor::type((FieldDescriptor *)in_stack_fffffffffffffc80);
      if (TVar4 == TYPE_STRING) {
        std::__cxx11::string::string(local_1c0);
        __lhs = FieldDescriptor::default_value_string_abi_cxx11_(local_10);
        uVar2 = anon_unknown_0::EscapeJSString(in_stack_fffffffffffffd38,out_00);
        local_1c1 = uVar2;
        if (!(bool)uVar2) {
          internal::LogMessage::LogMessage
                    (in_stack_fffffffffffffc80,(LogLevel)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                     (char *)in_stack_fffffffffffffc70,
                     (int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
          FieldDescriptor::full_name_abi_cxx11_(local_10);
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffc70,(string *)in_stack_fffffffffffffc68);
          internal::LogMessage::operator<<
                    (in_stack_fffffffffffffc70,(char *)in_stack_fffffffffffffc68);
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
          internal::LogMessage::~LogMessage((LogMessage *)0x46a6c1);
        }
        std::operator+((char *)__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffcb0));
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_1c0);
      }
      else {
        FieldDescriptor::default_value_string_abi_cxx11_(local_10);
        anon_unknown_0::EscapeBase64(in_stack_fffffffffffffcd8);
        std::operator+((char *)in_stack_fffffffffffffc78,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffc70);
        std::operator+(in_stack_fffffffffffffc78,(char *)in_stack_fffffffffffffc70);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_268);
      }
      break;
    case (string *)0x9:
      paVar6 = &local_269;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"null",paVar6);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      break;
    default:
      this_00 = &local_2a8;
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffc80,(LogLevel)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                 (char *)this_00,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20));
      internal::LogMessage::operator<<(this_00,(char *)in_stack_fffffffffffffc68);
      internal::LogFinisher::operator=((LogFinisher *)this_00,in_stack_fffffffffffffc68);
      internal::LogMessage::~LogMessage((LogMessage *)0x46a911);
      paVar6 = local_2aa;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)in_RDI,"",paVar6);
      std::allocator<char>::~allocator((allocator<char> *)local_2aa);
    }
  }
  return in_RDI;
}

Assistant:

std::string JSFieldDefault(const FieldDescriptor* field) {
  if (field->is_repeated()) {
    return "[]";
  }

  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int32()));
    case FieldDescriptor::CPPTYPE_UINT32:
      // The original codegen is in Java, and Java protobufs store unsigned
      // integer values as signed integer values. In order to exactly match the
      // output, we need to reinterpret as base-2 signed. Ugh.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int32>(field->default_value_uint32())));
    case FieldDescriptor::CPPTYPE_INT64:
      return MaybeNumberString(field,
                               StrCat(field->default_value_int64()));
    case FieldDescriptor::CPPTYPE_UINT64:
      // See above note for uint32 -- reinterpreting as signed.
      return MaybeNumberString(
          field,
          StrCat(static_cast<int64>(field->default_value_uint64())));
    case FieldDescriptor::CPPTYPE_ENUM:
      return StrCat(field->default_value_enum()->number());
    case FieldDescriptor::CPPTYPE_BOOL:
      return field->default_value_bool() ? "true" : "false";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return FloatToString(field->default_value_float());
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return DoubleToString(field->default_value_double());
    case FieldDescriptor::CPPTYPE_STRING:
      if (field->type() == FieldDescriptor::TYPE_STRING) {
        std::string out;
        bool is_valid = EscapeJSString(field->default_value_string(), &out);
        if (!is_valid) {
          // TODO(b/115551870): Decide whether this should be a hard error.
          GOOGLE_LOG(WARNING) << "The default value for field " << field->full_name()
                       << " was truncated since it contained invalid UTF-8 or"
                          " codepoints outside the basic multilingual plane.";
        }
        return "\"" + out + "\"";
      } else {  // Bytes
        return "\"" + EscapeBase64(field->default_value_string()) + "\"";
      }
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "null";
  }
  GOOGLE_LOG(FATAL) << "Shouldn't reach here.";
  return "";
}